

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_handle_possible_reconnect(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  ulong uVar3;
  uchar *puVar4;
  void *pvVar5;
  uchar *puVar6;
  size_t sVar7;
  uchar *puVar8;
  char cVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uchar uVar13;
  int iVar14;
  int iVar15;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ulong uVar16;
  uchar *local_38;
  
  pmVar1 = ssl->conf;
  p_Var2 = pmVar1->f_cookie_write;
  if (pmVar1->f_cookie_check == (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0 ||
      p_Var2 == (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
    iVar15 = -0x7100;
  }
  else {
    uVar3 = ssl->in_left;
    iVar15 = -0x7900;
    if ((((((0x3c < uVar3) && (puVar4 = ssl->in_buf, *puVar4 == '\x16')) && (puVar4[3] == '\0')) &&
         ((puVar4[4] == '\0' && (puVar4[0x13] == '\0')))) &&
        ((puVar4[0x14] == '\0' &&
         ((puVar4[0x15] == '\0' && (uVar16 = (ulong)puVar4[0x3b], uVar16 <= uVar3 - 0x3d)))))) &&
       ((ulong)puVar4[uVar16 + 0x3c] <= uVar3 - 0x3c)) {
      pvVar5 = pmVar1->p_cookie;
      puVar6 = ssl->cli_id;
      sVar7 = ssl->cli_id_len;
      puVar8 = ssl->out_buf;
      iVar15 = (*pmVar1->f_cookie_check)
                         (pvVar5,puVar4 + uVar16 + 0x3d,(ulong)puVar4[uVar16 + 0x3c],puVar6,sVar7);
      if (iVar15 == 0) {
        iVar15 = 0;
        in_RDX = extraout_RDX;
      }
      else {
        uVar10 = *(undefined8 *)puVar4;
        uVar11 = *(undefined8 *)(puVar4 + 8);
        uVar12 = *(undefined8 *)(puVar4 + 0x11);
        *(undefined8 *)(puVar8 + 9) = *(undefined8 *)(puVar4 + 9);
        *(undefined8 *)(puVar8 + 0x11) = uVar12;
        *(undefined8 *)puVar8 = uVar10;
        *(undefined8 *)(puVar8 + 8) = uVar11;
        puVar8[0xd] = '\x03';
        puVar8[0x19] = 0xfe;
        puVar8[0x1a] = 0xff;
        local_38 = puVar8 + 0x1c;
        iVar15 = (*p_Var2)(pvVar5,&local_38,puVar8 + 0x4000,puVar6,sVar7);
        if (iVar15 == 0) {
          in_RDX = (long)local_38 - (long)puVar8;
          cVar9 = (char)in_RDX;
          puVar8[0x1b] = cVar9 + 0xe4;
          iVar15 = (int)in_RDX;
          uVar13 = (uchar)((uint)(iVar15 + 0xffffe7) >> 0x10);
          puVar8[0x16] = uVar13;
          puVar8[0xe] = uVar13;
          uVar13 = (uchar)((uint)(iVar15 + 0xffe7) >> 8);
          puVar8[0x17] = uVar13;
          puVar8[0xf] = uVar13;
          puVar8[0x18] = cVar9 + 0xe7;
          puVar8[0x10] = cVar9 + 0xe7;
          puVar8[0xb] = (uchar)((uint)(iVar15 + 0xfff3) >> 8);
          puVar8[0xc] = cVar9 + 0xf3;
          iVar15 = -0x6a80;
        }
        else {
          iVar15 = -0x6c00;
          in_RDX = extraout_RDX_00;
        }
      }
    }
  }
  if (iVar15 == 0) {
    iVar14 = ssl_session_reset_int(ssl,1);
    iVar15 = -0x6780;
    if (iVar14 != 0) {
      iVar15 = iVar14;
    }
  }
  else if (iVar15 == -0x6a80) {
    (*ssl->f_send)(ssl->p_bio,ssl->out_buf,in_RDX);
    iVar15 = -0x6a80;
  }
  return iVar15;
}

Assistant:

static int ssl_handle_possible_reconnect( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t len;

    ret = ssl_check_dtls_clihlo_cookie(
            ssl->conf->f_cookie_write,
            ssl->conf->f_cookie_check,
            ssl->conf->p_cookie,
            ssl->cli_id, ssl->cli_id_len,
            ssl->in_buf, ssl->in_left,
            ssl->out_buf, MBEDTLS_SSL_MAX_CONTENT_LEN, &len );

    MBEDTLS_SSL_DEBUG_RET( 2, "ssl_check_dtls_clihlo_cookie", ret );

    if( ret == MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED )
    {
        /* Don't check write errors as we can't do anything here.
         * If the error is permanent we'll catch it later,
         * if it's not, then hopefully it'll work next time. */
        (void) ssl->f_send( ssl->p_bio, ssl->out_buf, len );

        return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
    }

    if( ret == 0 )
    {
        /* Got a valid cookie, partially reset context */
        if( ( ret = ssl_session_reset_int( ssl, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "reset", ret );
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_CLIENT_RECONNECT );
    }

    return( ret );
}